

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *this_00;
  cmake *pcVar4;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar5;
  bool bVar6;
  pointer ppcVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  PolicyID id;
  ulong uVar11;
  ostringstream w;
  cmCommandContext local_260;
  cmListFileBacktrace local_238;
  string local_1f8;
  Snapshot local_1d8;
  Snapshot local_1c0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  (*this->_vptr_cmGlobalGenerator[0x23])();
  ProcessEvaluationFiles(this);
  ppcVar7 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar7) {
    uVar11 = 0;
    do {
      this->CurrentMakefile = ppcVar7[uVar11]->Makefile;
      (*ppcVar7[uVar11]->_vptr_cmLocalGenerator[2])();
      this_00 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11]->Makefile;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
      bVar5 = cmMakefile::IsOn(this_00,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (!bVar5) {
        cmLocalGenerator::GenerateInstallRules
                  ((this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11]);
      }
      cmLocalGenerator::GenerateTestFiles
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar11]);
      cmake::UpdateProgress
                (this->CMakeInstance,"Generating",
                 ((float)uVar11 + 1.0) /
                 (float)(ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
      uVar11 = (ulong)((int)uVar11 + 1);
      ppcVar7 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar7 >> 3)
            );
  }
  this->CurrentMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var8 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar5 = (_Rb_tree_header *)p_Var8 != &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header
    ;
    if (!bVar5) {
LAB_003a32e8:
      CheckRuleHashes(this);
      WriteSummary(this);
      if (this->ExtraGenerator != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this->ExtraGenerator->_vptr_cmExternalMakefileProjectGenerator[6])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_238,(cmPolicies *)0x2a,id);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_238.Context.Name._M_dataplus._M_p,
                            local_238.Context.Name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238.Context.Name._M_dataplus._M_p != &local_238.Context.Name.field_2) {
          operator_delete(local_238.Context.Name._M_dataplus._M_p,
                          CONCAT71(local_238.Context.Name.field_2._M_allocated_capacity._1_7_,
                                   local_238.Context.Name.field_2._M_local_buf[0]) + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MACOSX_RPATH is not specified for the following targets:\n"
                   ,0x39);
        p_Var10 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,*(char **)(p_Var10 + 1),
                                (long)p_Var10[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != p_Var1);
        }
        pcVar4 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmState::Snapshot::Snapshot(&local_1d8,(cmState *)0x0);
        paVar2 = &local_260.Name.field_2;
        local_260.Name._M_string_length = 0;
        local_260.Name.field_2._M_local_buf[0] = '\0';
        local_260.Line = 0;
        snapshot.Position.Tree = local_1d8.Position.Tree;
        snapshot.State = local_1d8.State;
        snapshot.Position.Position = local_1d8.Position.Position;
        local_260.Name._M_dataplus._M_p = (pointer)paVar2;
        cmListFileBacktrace::cmListFileBacktrace(&local_238,snapshot,&local_260);
        cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_1f8,&local_238,false);
        cmListFileBacktrace::~cmListFileBacktrace(&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.Name._M_dataplus._M_p != paVar2) {
          operator_delete(local_260.Name._M_dataplus._M_p,
                          CONCAT71(local_260.Name.field_2._M_allocated_capacity._1_7_,
                                   local_260.Name.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      cmake::UpdateProgress(this->CMakeInstance,"Generating done",-1.0);
      return;
    }
    bVar6 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var8 + 2));
    if ((((!bVar6) && (cmSystemTools::s_ErrorOccured == false)) &&
        (cmSystemTools::s_FatalErrorOccured == false)) &&
       (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
      pcVar4 = this->CMakeInstance;
      paVar2 = &local_260.Name.field_2;
      local_260.Name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"Could not write export file.","");
      cmState::Snapshot::Snapshot(&local_1c0,(cmState *)0x0);
      paVar3 = &local_238.Context.Name.field_2;
      local_238.Context.Name._M_string_length = 0;
      local_238.Context.Name.field_2._M_local_buf[0] = '\0';
      local_238.Context.Line = 0;
      snapshot_00.Position.Tree = local_1c0.Position.Tree;
      snapshot_00.State = local_1c0.State;
      snapshot_00.Position.Position = local_1c0.Position.Position;
      local_238.Context.Name._M_dataplus._M_p = (pointer)paVar3;
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)local_1a8,snapshot_00,&local_238.Context);
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_260.Name,(cmListFileBacktrace *)local_1a8,false)
      ;
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.Context.Name._M_dataplus._M_p != paVar3) {
        operator_delete(local_238.Context.Name._M_dataplus._M_p,
                        CONCAT71(local_238.Context.Name.field_2._M_allocated_capacity._1_7_,
                                 local_238.Context.Name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.Name._M_dataplus._M_p != paVar2) {
        operator_delete(local_260.Name._M_dataplus._M_p,
                        CONCAT71(local_260.Name.field_2._M_allocated_capacity._1_7_,
                                 local_260.Name.field_2._M_local_buf[0]) + 1);
      }
      if (bVar5) {
        return;
      }
      goto LAB_003a32e8;
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if(!this->LocalGenerators[i]->GetMakefile()->IsOn(
      "CMAKE_SKIP_INSTALL_RULES"))
      {
      this->LocalGenerators[i]->GenerateInstallRules();
      }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress("Generating",
      (static_cast<float>(i)+1.0f)/
       static_cast<float>(this->LocalGenerators.size()));
    }
  this->SetCurrentMakefile(0);

  if(!this->GenerateCPackPropertiesFile())
    {
    this->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, "Could not write CPack properties file.");
    }

  for (std::map<std::string, cmExportBuildFileGenerator*>::iterator
      it = this->BuildExportSets.begin(); it != this->BuildExportSets.end();
      ++it)
    {
    if (!it->second->GenerateImportFile()
        && !cmSystemTools::GetErrorOccuredFlag())
      {
      this->GetCMakeInstance()
          ->IssueMessage(cmake::FATAL_ERROR, "Could not write export file.");
      return;
      }
    }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator != 0)
    {
    this->ExtraGenerator->Generate();
    }

  if(!this->CMP0042WarnTargets.empty())
    {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for(std::set<std::string>::iterator
      iter = this->CMP0042WarnTargets.begin();
      iter != this->CMP0042WarnTargets.end();
      ++iter)
      {
      w << " " << *iter << "\n";
      }
    this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}